

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

file_format_t __thiscall
cfgfile::details::determine_format_t<cfgfile::string_trait_t>::format
          (determine_format_t<cfgfile::string_trait_t> *this)

{
  istream *piVar1;
  char cVar2;
  int iVar3;
  char_t ch;
  char local_2a;
  char local_29;
  
  if (format()::xml == '\0') {
    format();
  }
  local_29 = '\0';
  do {
    piVar1 = this->m_stream;
    local_2a = '\0';
    std::operator>>(piVar1,&local_2a);
    if (local_2a == '\0') {
      return cfgfile_format;
    }
    std::istream::putback((char)piVar1);
    std::operator>>(this->m_stream,&local_29);
    cVar2 = local_29;
    iVar3 = isspace((int)local_29);
  } while (iVar3 != 0);
  return (uint)(cVar2 == format::xml);
}

Assistant:

file_format_t format()
	{
		static const typename Trait::char_t xml = Trait::from_ascii( '<' );

		typename Trait::char_t ch( 0x00 );

		while( !Trait::is_at_end( m_stream ) )
		{
			m_stream >> ch;

			if( Trait::is_space( ch ) )
				continue;

			if( ch == xml )
				return file_format_t::xml_format;
			else
				return file_format_t::cfgfile_format;
		}

		return file_format_t::cfgfile_format;
	}